

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char * stb_fgets_malloc(FILE *f)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  int __n;
  char *__s;
  char quick_buffer [800];
  char acStack_348 [798];
  char local_2a;
  
  local_2a = '\0';
  pcVar3 = fgets(acStack_348,800,(FILE *)f);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else if (local_2a == '\0') {
    sVar5 = strlen(acStack_348);
    if ((0 < (int)sVar5) && (uVar2 = (int)sVar5 - 1, acStack_348[uVar2] == '\n')) {
      acStack_348[uVar2] = '\0';
    }
    pcVar3 = strdup(acStack_348);
  }
  else {
    pcVar3 = strdup(acStack_348);
    iVar1 = 799;
    do {
      __n = iVar1;
      iVar1 = feof((FILE *)f);
      if ((iVar1 != 0) || (pcVar3[(long)__n + -1] == '\n')) goto LAB_00150231;
      pcVar3 = (char *)realloc(pcVar3,(long)(__n * 2));
      __s = pcVar3 + __n;
      __s[(long)__n + -2] = '\0';
      pcVar4 = fgets(__s,__n,(FILE *)f);
      if (pcVar4 == (char *)0x0) goto LAB_00150231;
      iVar1 = __n * 2 + -1;
    } while (__s[(long)__n + -2] != '\0');
    sVar5 = strlen(__s);
    __n = __n + (int)sVar5;
LAB_00150231:
    if (pcVar3[(long)__n + -1] == '\n') {
      pcVar3[(long)__n + -1] = '\0';
    }
  }
  return pcVar3;
}

Assistant:

char * stb_fgets_malloc(FILE *f)
{
   // avoid reallocing for small strings
   char quick_buffer[800];
   quick_buffer[sizeof(quick_buffer)-2] = 0;
   if (!fgets(quick_buffer, sizeof(quick_buffer), f))
      return NULL;

   if (quick_buffer[sizeof(quick_buffer)-2] == 0) {
      int n = strlen(quick_buffer);
      if (n > 0 && quick_buffer[n-1] == '\n')
         quick_buffer[n-1] = 0;
      return strdup(quick_buffer);
   } else {
      char *p;
      char *a = strdup(quick_buffer);
      int len = sizeof(quick_buffer)-1;

      while (!feof(f)) {
         if (a[len-1] == '\n') break;
         a = (char *) realloc(a, len*2);
         p = &a[len];
         p[len-2] = 0;
         if (!fgets(p, len, f))
            break;
         if (p[len-2] == 0) {
            len += strlen(p);
            break;
         }
         len = len + (len-1);
      }
      if (a[len-1] == '\n')
         a[len-1] = 0;
      return a;
   }
}